

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O1

int coda_path_from_path(char *initialpath,int is_filepath,char *appendpath,char **resultpath)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  char *__dest;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  uVar5 = strlen(initialpath);
  if (appendpath == (char *)0x0) {
    uVar7 = 0;
  }
  else {
    sVar6 = strlen(appendpath);
    uVar7 = (uint)sVar6;
  }
  if (0 < (int)(uint)uVar5 && is_filepath != 0) {
    uVar5 = (ulong)((uint)uVar5 & 0x7fffffff);
    do {
      if ((initialpath[uVar5 - 1] == '/') || (initialpath[uVar5 - 1] == '\\')) goto LAB_00166bbd;
      bVar3 = 1 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar3);
    uVar5 = 0;
  }
LAB_00166bbd:
  __dest = (char *)malloc((long)(int)(uVar7 + (int)uVar5 + 2));
  *resultpath = __dest;
  if (__dest == (char *)0x0) {
    iVar9 = -1;
    coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                   ,0x1e1);
  }
  else {
    if (0 < (int)uVar5) {
      memcpy(__dest,initialpath,uVar5 & 0xffffffff);
      __dest = __dest + (uVar5 & 0xffffffff);
      if (0 < (int)uVar7) {
        *__dest = '/';
        __dest = __dest + 1;
      }
    }
    if (0 < (int)uVar7) {
      memcpy(__dest,appendpath,(ulong)uVar7);
      __dest = __dest + uVar7;
    }
    *__dest = '\0';
    pbVar2 = (byte *)*resultpath;
    if (pbVar2 != (byte *)0x0) {
      bVar1 = *pbVar2;
      if (bVar1 == 0) {
        return (uint)bVar1;
      }
      uVar5 = 0;
      if (bVar1 == 0x2e) {
        uVar8 = 0;
        do {
          uVar5 = uVar8;
          if (pbVar2[uVar8 + 1] != 0x2f) break;
          uVar5 = uVar8 + 2;
          lVar10 = uVar8 + 2;
          uVar8 = uVar5;
        } while (pbVar2[lVar10] == 0x2e);
      }
      uVar7 = 0;
LAB_00166c7e:
      uVar11 = (uint)uVar5;
      lVar10 = (long)(int)uVar11;
      bVar1 = pbVar2[lVar10];
      if ((bVar1 == 0x2f) || (bVar1 == 0x5c)) goto LAB_00166c91;
      if (bVar1 != 0) goto LAB_00166d0e;
      if (uVar7 == 0) {
        *pbVar2 = 0x2e;
        uVar7 = 1;
      }
      pbVar2[(int)uVar7] = 0;
    }
    iVar9 = 0;
  }
  return iVar9;
LAB_00166c91:
  uVar5 = lVar10 + 1;
  bVar1 = pbVar2[lVar10 + 1];
  if ((bVar1 == 0x5c) || (bVar1 == 0x2f)) goto LAB_00166c7e;
  if (bVar1 == 0x2e) {
    uVar5 = lVar10 + 2;
    bVar1 = pbVar2[lVar10 + 2];
    if (bVar1 < 0x2f) {
      if (bVar1 == 0) goto LAB_00166c7e;
      if ((bVar1 == 0x2e) &&
         (((bVar1 = pbVar2[lVar10 + 3], bVar1 == 0 || (bVar1 == 0x5c)) || (bVar1 == 0x2f)))) {
        uVar5 = (ulong)uVar7;
        if (((1 < (int)uVar7) && (pbVar2[uVar5 - 1] == 0x2e)) && (pbVar2[uVar5 - 2] == 0x2e)) {
          if (uVar7 == 2) {
            uVar7 = 2;
            goto LAB_00166d0e;
          }
          if ((pbVar2[uVar5 - 3] == 0x2f) || (pbVar2[uVar5 - 3] == 0x5c)) goto LAB_00166d0e;
        }
        uVar13 = uVar7;
        while (uVar12 = uVar13, uVar5 = uVar5 - 1, uVar4 = uVar11, uVar13 = uVar7, 0 < (int)uVar12)
        {
          uVar13 = uVar12 - 1;
          uVar4 = uVar11 + 3;
          if ((pbVar2[uVar5 & 0xffffffff] == 0x5c) || (pbVar2[uVar5 & 0xffffffff] == 0x2f)) break;
        }
        uVar7 = uVar13;
        uVar11 = uVar4;
        uVar5 = (ulong)uVar11;
        if (0 < (int)uVar12) goto LAB_00166c7e;
      }
    }
    else if ((bVar1 == 0x2f) || (bVar1 == 0x5c)) goto LAB_00166c7e;
  }
LAB_00166d0e:
  pbVar2[(int)uVar7] = pbVar2[(int)uVar11];
  uVar5 = (ulong)(uVar11 + 1);
  uVar7 = uVar7 + 1;
  goto LAB_00166c7e;
}

Assistant:

int coda_path_from_path(const char *initialpath, int is_filepath, const char *appendpath, char **resultpath)
{
    char *path;
    int initialpath_length;
    int appendpath_length;

    initialpath_length = (int)strlen(initialpath);
    appendpath_length = (appendpath == NULL ? 0 : (int)strlen(appendpath));

    if (is_filepath && initialpath_length > 0)
    {
        /* remove trailing parth */
        while (initialpath_length > 0 && initialpath[initialpath_length - 1] != '/' &&
               initialpath[initialpath_length - 1] != '\\')
        {
            initialpath_length--;
        }
    }

    *resultpath = malloc(initialpath_length + 1 + appendpath_length + 1);
    if (*resultpath == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        return -1;
    }
    path = *resultpath;
    if (initialpath_length > 0)
    {
        memcpy(path, initialpath, initialpath_length);
        path += initialpath_length;
        if (appendpath_length > 0)
        {
            *path = '/';
            path++;
        }
    }
    if (appendpath_length > 0)
    {
        memcpy(path, appendpath, appendpath_length);
        path += appendpath_length;
    }
    *path = '\0';

    clean_path(*resultpath);

    return 0;
}